

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O3

int Curl_debug(Curl_easy *data,curl_infotype type,char *ptr,size_t size,connectdata *conn)

{
  uint uVar1;
  int iVar2;
  size_t size_00;
  char buffer [160];
  char acStack_c8 [160];
  
  if ((((conn != (connectdata *)0x0) && ((data->set).printhost != false)) &&
      ((conn->host).dispname != (char *)0x0)) && (uVar1 = type - CURLINFO_HEADER_IN, uVar1 < 4)) {
    curl_msnprintf(acStack_c8,0xa0,"[%s %s %s]",
                   &DAT_00146358 + *(int *)(&DAT_00146358 + (ulong)uVar1 * 4),
                   &DAT_00146348 + *(int *)(&DAT_00146348 + (ulong)uVar1 * 4));
    size_00 = strlen(acStack_c8);
    iVar2 = showit(data,CURLINFO_TEXT,acStack_c8,size_00);
    if (iVar2 != 0) {
      return iVar2;
    }
  }
  iVar2 = showit(data,type,ptr,size);
  return iVar2;
}

Assistant:

int Curl_debug(struct Curl_easy *data, curl_infotype type,
               char *ptr, size_t size,
               struct connectdata *conn)
{
  int rc;
  if(data->set.printhost && conn && conn->host.dispname) {
    char buffer[160];
    const char *t=NULL;
    const char *w="Data";
    switch(type) {
    case CURLINFO_HEADER_IN:
      w = "Header";
      /* FALLTHROUGH */
    case CURLINFO_DATA_IN:
      t = "from";
      break;
    case CURLINFO_HEADER_OUT:
      w = "Header";
      /* FALLTHROUGH */
    case CURLINFO_DATA_OUT:
      t = "to";
      break;
    default:
      break;
    }

    if(t) {
      snprintf(buffer, sizeof(buffer), "[%s %s %s]", w, t,
               conn->host.dispname);
      rc = showit(data, CURLINFO_TEXT, buffer, strlen(buffer));
      if(rc)
        return rc;
    }
  }
  rc = showit(data, type, ptr, size);
  return rc;
}